

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  string msg;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_28 = 0;
  local_20[0] = 0;
  local_30 = local_20;
  std::__cxx11::string::append((char *)&local_30);
  std::__cxx11::string::append((char *)&local_30);
  PyErr_SetString(_PyExc_TypeError,local_30);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg;
#if defined(PYPY_VERSION)
    msg += handle((PyObject *) type).attr("__module__").cast<std::string>() + ".";
#endif
    msg += type->tp_name;
    msg += ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}